

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

PolymorphicInlineCacheInfoIDL * __thiscall
Memory::AllocateArray<Memory::Recycler,PolymorphicInlineCacheInfoIDL,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined8 *puVar1;
  PolymorphicInlineCacheInfoIDL *pPVar2;
  ulong uVar3;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pPVar2 = (PolymorphicInlineCacheInfoIDL *)0x8;
  }
  else {
    uVar3 = 0;
    pPVar2 = (PolymorphicInlineCacheInfoIDL *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3b != 0) | count << 5,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    do {
      *(undefined8 *)((long)&(pPVar2->functionBodyAddr).ptr + uVar3) = 0;
      puVar1 = (undefined8 *)((long)&(pPVar2->polymorphicCacheUtilizationArray).ptr + uVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar3 = uVar3 + 0x20;
    } while (count << 5 != uVar3);
  }
  return pPVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}